

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpege_vepu540c.c
# Opt level: O1

MPP_RET hal_jpege_v540c_start(void *hal,HalEncTask *enc_task)

{
  long lVar1;
  long lVar2;
  MPP_RET MVar3;
  char *fmt;
  int level;
  ulong uVar4;
  MppDevRegWrCfg cfg;
  MppDevRegRdCfg cfg1;
  long local_48 [3];
  undefined8 local_30;
  
  lVar1 = *(long *)((long)hal + 0x70);
  lVar2 = *(long *)((long)hal + 0x78);
  if (((byte)hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_v540c","(%d) enter\n","hal_jpege_v540c_start",0xee);
  }
  if ((enc_task->flags).err != 0) {
    _mpp_log_l(2,"hal_jpege_v540c","enc_task->flags.err %08x, return e arly","hal_jpege_v540c_start"
              );
    return MPP_NOK;
  }
  local_48[1] = 0x124;
  local_48[0] = lVar1;
  MVar3 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),4,local_48);
  if (MVar3 == MPP_OK) {
    local_48[0] = lVar1 + 0x338;
    local_48[1] = 0x2c8000000180;
    MVar3 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),4,local_48);
    if (MVar3 != MPP_OK) goto LAB_0024729d;
    local_48[0] = lVar1 + 0x124;
    local_48[1] = 0x27000000214;
    MVar3 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),4,local_48);
    if (MVar3 != MPP_OK) goto LAB_0024729d;
    local_30 = 0x2c00000004;
    local_48[2] = lVar2;
    MVar3 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),5,local_48 + 2);
    if (MVar3 == MPP_OK) {
      local_48[2] = lVar2 + 4;
      local_30 = 0x400000000250;
      MVar3 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),5,local_48 + 2);
      if (MVar3 == MPP_OK) {
        MVar3 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),0xf,(void *)0x0);
        if (MVar3 != MPP_OK) {
          _mpp_log_l(2,"hal_jpege_v540c","send cmd failed %d\n","hal_jpege_v540c_start",
                     (ulong)(uint)MVar3);
        }
        if (((byte)hal_jpege_debug & 1) == 0) {
          return MVar3;
        }
        fmt = "(%d) leave\n";
        level = 4;
        uVar4 = 300;
        goto LAB_002472bc;
      }
    }
    fmt = "set register read failed %d\n";
  }
  else {
LAB_0024729d:
    fmt = "set register write failed %d\n";
  }
  uVar4 = (ulong)(uint)MVar3;
  level = 2;
LAB_002472bc:
  _mpp_log_l(level,"hal_jpege_v540c",fmt,"hal_jpege_v540c_start",uVar4);
  return MVar3;
}

Assistant:

MPP_RET hal_jpege_v540c_start(void *hal, HalEncTask *enc_task)
{
    MPP_RET ret = MPP_OK;
    jpegeV540cHalContext *ctx = (jpegeV540cHalContext *)hal;
    JpegV540cRegSet *hw_regs = ctx->regs;
    JpegV540cStatus *reg_out = ctx->reg_out;
    MppDevRegWrCfg cfg;
    MppDevRegRdCfg cfg1;
    hal_jpege_enter();

    if (enc_task->flags.err) {
        mpp_err_f("enc_task->flags.err %08x, return e arly",
                  enc_task->flags.err);
        return MPP_NOK;
    }

    cfg.reg = (RK_U32*)&hw_regs->reg_ctl;
    cfg.size = sizeof(jpeg_vepu540c_control_cfg);
    cfg.offset = VEPU540C_CTL_OFFSET;

    ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &cfg);
    if (ret) {
        mpp_err_f("set register write failed %d\n", ret);
        return ret;
    }

    cfg.reg = &hw_regs->jpeg_table;
    cfg.size = sizeof(vepu540c_jpeg_tab);
    cfg.offset = VEPU540C_JPEGTAB_OFFSET;

    ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &cfg);
    if (ret) {
        mpp_err_f("set register write failed %d\n", ret);
        return ret;
    }

    cfg.reg = &hw_regs->reg_base;
    cfg.size = sizeof(jpeg_vepu540c_base);
    cfg.offset = VEPU540C_BASE_OFFSET;

    ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &cfg);
    if (ret) {
        mpp_err_f("set register write failed %d\n", ret);
        return ret;
    }

    cfg1.reg = &reg_out->hw_status;
    cfg1.size = sizeof(RK_U32);
    cfg1.offset = VEPU540C_REG_BASE_HW_STATUS;

    ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_RD, &cfg1);
    if (ret) {
        mpp_err_f("set register read failed %d\n", ret);
        return ret;
    }

    cfg1.reg = &reg_out->st;
    cfg1.size = sizeof(JpegV540cStatus) - 4;
    cfg1.offset = VEPU540C_STATUS_OFFSET;

    ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_RD, &cfg1);
    if (ret) {
        mpp_err_f("set register read failed %d\n", ret);
        return ret;
    }

    ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_SEND, NULL);
    if (ret) {
        mpp_err_f("send cmd failed %d\n", ret);
    }
    hal_jpege_leave();
    return ret;
}